

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O1

void __thiscall asl::SocketServer::startLoop(SocketServer *this)

{
  AtomicCount *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  SockClientThread *this_00;
  ulong uVar3;
  ulong uVar4;
  Socket client;
  SmartObject local_50;
  SmartObject_ *local_48;
  uint local_3c;
  Sockets *local_38;
  
  local_38 = &this->_sockets;
  do {
    local_3c = Sockets::waitInput(local_38,2.0);
    if (0 < (int)local_3c) {
      uVar4 = (ulong)local_3c;
      uVar3 = 0;
      do {
        iVar2 = (*((this->_sockets).changed._a[uVar3].super_SmartObject._p)->_vptr_SmartObject_[9])
                          ();
        local_50._p = (SmartObject_ *)CONCAT44(extraout_var,iVar2);
        if (local_50._p != (SmartObject_ *)0x0) {
          LOCK();
          ((local_50._p)->rc).n = ((local_50._p)->rc).n + 1;
          UNLOCK();
        }
        LOCK();
        (this->_numClients).n = (this->_numClients).n + 1;
        UNLOCK();
        if (this->_sequential == true) {
          if (local_50._p != (SmartObject_ *)0x0) {
            LOCK();
            ((local_50._p)->rc).n = ((local_50._p)->rc).n + 1;
            UNLOCK();
          }
          local_48 = local_50._p;
          (**this->_vptr_SocketServer)(this,&local_48);
          if (local_48 != (SmartObject_ *)0x0) {
            LOCK();
            pAVar1 = &local_48->rc;
            pAVar1->n = pAVar1->n + -1;
            UNLOCK();
            if ((pAVar1->n == 0) && (local_48 != (SmartObject_ *)0x0)) {
              (*local_48->_vptr_SmartObject_[1])();
            }
          }
          (*(local_50._p)->_vptr_SmartObject_[0xb])();
          LOCK();
          (this->_numClients).n = (this->_numClients).n + -1;
          UNLOCK();
        }
        else {
          this_00 = (SockClientThread *)operator_new(0x28);
          SockClientThread::SockClientThread(this_00,this,(Socket *)&local_50);
        }
        if (local_50._p != (SmartObject_ *)0x0) {
          LOCK();
          pAVar1 = &(local_50._p)->rc;
          pAVar1->n = pAVar1->n + -1;
          UNLOCK();
          if ((pAVar1->n == 0) && (local_50._p != (SmartObject_ *)0x0)) {
            (*(local_50._p)->_vptr_SmartObject_[1])();
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  } while ((-1 < (int)local_3c) && (this->_requestStop == false));
  this->_running = false;
  return;
}

Assistant:

void SocketServer::startLoop()
{
	int n;
	do
	{
		if ((n = _sockets.waitInput(2)) > 0)
		{
			for (int i = 0; i < n; i++)
			{
				Socket client = _sockets.activeAt(i).accept();
				++_numClients;
				if (_sequential) {
					serve(client);
					client.close();
					--_numClients;
				}
				else
					new SockClientThread(this, client);
			}
		}
		if(_requestStop || n < 0)
		{
			_running = false;
			break;
		}
		
	}
	while(true);
}